

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CoverageBinsSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageBinsSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::CoverageBinsArraySizeSyntax*,slang::parsing::Token,slang::syntax::CoverageBinInitializerSyntax&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,CoverageBinsArraySizeSyntax **args_4,
          Token *args_5,CoverageBinInitializerSyntax *args_6,CoverageIffClauseSyntax **args_7,
          Token *args_8)

{
  CoverageBinsArraySizeSyntax *pCVar1;
  CoverageIffClauseSyntax *pCVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  TokenKind TVar20;
  undefined1 uVar21;
  NumericTokenFlags NVar22;
  uint32_t uVar23;
  TokenKind TVar24;
  undefined1 uVar25;
  NumericTokenFlags NVar26;
  uint32_t uVar27;
  CoverageBinsSyntax *this_00;
  
  this_00 = (CoverageBinsSyntax *)allocate(this,0xb8,8);
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar3 = args_1->info;
  TVar12 = args_2->kind;
  uVar13 = args_2->field_0x2;
  NVar14.raw = (args_2->numFlags).raw;
  uVar15 = args_2->rawLen;
  pIVar4 = args_2->info;
  TVar16 = args_3->kind;
  uVar17 = args_3->field_0x2;
  NVar18.raw = (args_3->numFlags).raw;
  uVar19 = args_3->rawLen;
  pIVar5 = args_3->info;
  pCVar1 = *args_4;
  TVar20 = args_5->kind;
  uVar21 = args_5->field_0x2;
  NVar22.raw = (args_5->numFlags).raw;
  uVar23 = args_5->rawLen;
  pIVar6 = args_5->info;
  pCVar2 = *args_7;
  TVar24 = args_8->kind;
  uVar25 = args_8->field_0x2;
  NVar26.raw = (args_8->numFlags).raw;
  uVar27 = args_8->rawLen;
  pIVar7 = args_8->info;
  syntax::MemberSyntax::MemberSyntax((MemberSyntax *)this_00,CoverageBins,args);
  (this_00->wildcard).kind = TVar8;
  (this_00->wildcard).field_0x2 = uVar9;
  (this_00->wildcard).numFlags = (NumericTokenFlags)NVar10.raw;
  (this_00->wildcard).rawLen = uVar11;
  (this_00->wildcard).info = pIVar3;
  (this_00->keyword).kind = TVar12;
  (this_00->keyword).field_0x2 = uVar13;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar14.raw;
  (this_00->keyword).rawLen = uVar15;
  (this_00->keyword).info = pIVar4;
  (this_00->name).kind = TVar16;
  (this_00->name).field_0x2 = uVar17;
  (this_00->name).numFlags = (NumericTokenFlags)NVar18.raw;
  (this_00->name).rawLen = uVar19;
  (this_00->name).info = pIVar5;
  this_00->size = pCVar1;
  (this_00->equals).kind = TVar20;
  (this_00->equals).field_0x2 = uVar21;
  (this_00->equals).numFlags = (NumericTokenFlags)NVar22.raw;
  (this_00->equals).rawLen = uVar23;
  (this_00->equals).info = pIVar6;
  (this_00->initializer).ptr = args_6;
  this_00->iff = pCVar2;
  (this_00->semi).kind = TVar24;
  (this_00->semi).field_0x2 = uVar25;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar26.raw;
  (this_00->semi).rawLen = uVar27;
  (this_00->semi).info = pIVar7;
  if (pCVar1 != (CoverageBinsArraySizeSyntax *)0x0) {
    (pCVar1->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  }
  (args_6->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  if (pCVar2 != (CoverageIffClauseSyntax *)0x0) {
    (pCVar2->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  }
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }